

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

int __thiscall Fl_Type::user_defined(Fl_Type *this,char *cbname)

{
  Fl_Type **ppFVar1;
  char *__s1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  Fl_Type *pFVar3;
  
  pFVar3 = first;
  if (first != (Fl_Type *)0x0) {
    do {
      iVar2 = (*pFVar3->_vptr_Fl_Type[5])(pFVar3);
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Function");
      if ((iVar2 == 0) && (__s1 = pFVar3->name_, __s1 != (char *)0x0)) {
        __n = strlen(cbname);
        iVar2 = strncmp(__s1,cbname,__n);
        if ((iVar2 == 0) && (__s1[__n] == '(')) {
          return 1;
        }
      }
      ppFVar1 = &pFVar3->next;
      pFVar3 = *ppFVar1;
    } while (*ppFVar1 != (Fl_Type *)0x0);
  }
  return 0;
}

Assistant:

int Fl_Type::user_defined(const char* cbname) const {
  for (Fl_Type* p = Fl_Type::first; p ; p = p->next)
    if (strcmp(p->type_name(), "Function") == 0 && p->name() != 0)
      if (strncmp(p->name(), cbname, strlen(cbname)) == 0)
        if (p->name()[strlen(cbname)] == '(')
          return 1;
  return 0;
}